

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cpp
# Opt level: O0

void QtMWidgets::drawSliderHandle
               (QPainter *p,QRect *r,int xRadius,int yRadius,QColor *borderColor,QColor *lightColor)

{
  QRect *pQVar1;
  QRect *this;
  QColor QVar2;
  QMargins local_128;
  QRect local_118;
  QBrush local_108 [8];
  undefined6 local_100;
  undefined2 uStack_fa;
  undefined6 local_f8;
  undefined2 uStack_f2;
  undefined6 local_f0;
  undefined2 local_ea;
  undefined6 uStack_e8;
  undefined6 local_e0;
  undefined2 uStack_da;
  undefined6 local_d8;
  undefined2 uStack_d2;
  undefined6 local_d0;
  undefined2 local_ca;
  undefined6 uStack_c8;
  QPointF local_c0;
  QPointF local_b0;
  QLinearGradient local_a0 [8];
  QLinearGradient g;
  QBrush local_38 [8];
  QColor *local_30;
  QColor *lightColor_local;
  QColor *borderColor_local;
  int yRadius_local;
  int xRadius_local;
  QRect *r_local;
  QPainter *p_local;
  
  local_30 = lightColor;
  lightColor_local = borderColor;
  borderColor_local._0_4_ = yRadius;
  borderColor_local._4_4_ = xRadius;
  _yRadius_local = r;
  r_local = (QRect *)p;
  QPainter::setPen((QColor *)p);
  pQVar1 = r_local;
  QBrush::QBrush(local_38,(QColor *)local_30,SolidPattern);
  QPainter::setBrush((QBrush *)pQVar1);
  QBrush::~QBrush(local_38);
  QPainter::drawRoundedRect
            ((QPainter *)r_local,_yRadius_local,(double)borderColor_local._4_4_,
             (double)(int)borderColor_local,AbsoluteSize);
  QPointF::QPointF(&local_b0,0.0,0.0);
  QPointF::QPointF(&local_c0,0.0,1.0);
  QLinearGradient::QLinearGradient(local_a0,(QPointF *)&local_b0,(QPointF *)&local_c0);
  QGradient::setCoordinateMode((CoordinateMode)local_a0);
  QVar2 = darkerColor(local_30,0x4b);
  local_e0 = QVar2._0_6_;
  uStack_da = QVar2.ct._2_2_;
  local_d8 = QVar2.ct._4_6_;
  uStack_d2 = QVar2._14_2_;
  uStack_c8 = local_d8;
  local_d0 = local_e0;
  local_ca = uStack_da;
  QGradient::setColorAt(0.0,(QColor *)local_a0);
  QVar2 = darkerColor(local_30,10);
  local_100 = QVar2._0_6_;
  uStack_fa = QVar2.ct._2_2_;
  local_f8 = QVar2.ct._4_6_;
  uStack_f2 = QVar2._14_2_;
  uStack_e8 = local_f8;
  local_f0 = local_100;
  local_ea = uStack_fa;
  QGradient::setColorAt(1.0,(QColor *)local_a0);
  QPainter::setPen((PenStyle)r_local);
  pQVar1 = r_local;
  QBrush::QBrush(local_108,(QGradient *)local_a0);
  QPainter::setBrush((QBrush *)pQVar1);
  QBrush::~QBrush(local_108);
  this = r_local;
  pQVar1 = _yRadius_local;
  QMargins::QMargins(&local_128,2,2,2,2);
  local_118 = QRect::marginsRemoved(pQVar1,&local_128);
  QPainter::drawRoundedRect
            ((QPainter *)this,&local_118,(double)(borderColor_local._4_4_ + -4),
             (double)((int)borderColor_local + -4),AbsoluteSize);
  QLinearGradient::~QLinearGradient(local_a0);
  return;
}

Assistant:

void drawSliderHandle( QPainter * p, const QRect & r,
	int xRadius, int yRadius, const QColor & borderColor,
	const QColor & lightColor )
{
	p->setPen( borderColor );
	p->setBrush( lightColor );
	p->drawRoundedRect( r, xRadius, yRadius );

	QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 0.0, 1.0 ) );
	g.setCoordinateMode( QGradient::ObjectBoundingMode );
	g.setColorAt( 0.0, darkerColor( lightColor, 75 ) );
	g.setColorAt( 1.0, darkerColor( lightColor, 10 ) );

	p->setPen( Qt::NoPen );
	p->setBrush( g );

	p->drawRoundedRect( r.marginsRemoved( QMargins( 2, 2, 2, 2 ) ),
		xRadius - 4, yRadius - 4 );
}